

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_receiver.c
# Opt level: O0

void decode_message_value_callback(void *context,AMQP_VALUE decoded_value)

{
  BINARY_DATA amqp_data;
  _Bool _Var1;
  int iVar2;
  AMQP_VALUE value;
  LOGGER_LOG p_Var3;
  LOGGER_LOG l_20;
  LOGGER_LOG l_19;
  BINARY_DATA binary_data;
  LOGGER_LOG l_18;
  data data_value;
  LOGGER_LOG l_17;
  AMQP_VALUE body_data_value;
  LOGGER_LOG l_16;
  LOGGER_LOG l_15;
  LOGGER_LOG p_Stack_e0;
  MESSAGE_BODY_TYPE body_type_1;
  LOGGER_LOG l_14;
  LOGGER_LOG l_13;
  AMQP_VALUE body_amqp_value;
  LOGGER_LOG l_12;
  LOGGER_LOG l_11;
  LOGGER_LOG p_Stack_b0;
  MESSAGE_BODY_TYPE body_type;
  LOGGER_LOG l_10;
  LOGGER_LOG l_9;
  annotations footer;
  LOGGER_LOG l_8;
  LOGGER_LOG l_7;
  HEADER_HANDLE header;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  annotations message_annotations;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  annotations delivery_annotations;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  PROPERTIES_HANDLE properties;
  LOGGER_LOG l;
  AMQP_VALUE descriptor;
  MESSAGE_HANDLE decoded_message;
  MESSAGE_RECEIVER_INSTANCE *message_receiver;
  AMQP_VALUE decoded_value_local;
  void *context_local;
  
  descriptor = *(AMQP_VALUE *)((long)context + 0x30);
  decoded_message = (MESSAGE_HANDLE)context;
  message_receiver = (MESSAGE_RECEIVER_INSTANCE *)decoded_value;
  decoded_value_local = (AMQP_VALUE)context;
  l = (LOGGER_LOG)amqpvalue_get_inplace_descriptor(decoded_value);
  _Var1 = is_application_properties_type_by_descriptor((AMQP_VALUE)l);
  if (_Var1) {
    iVar2 = message_set_application_properties
                      ((MESSAGE_HANDLE)descriptor,(AMQP_VALUE)message_receiver);
    if (iVar2 != 0) {
      properties = (PROPERTIES_HANDLE)xlogging_get_log_function();
      if (properties != (PROPERTIES_HANDLE)0x0) {
        (*(code *)properties)
                  (0,
                   "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_receiver.c"
                   ,"decode_message_value_callback",0x2f,1,
                   "Error setting application properties on received message");
      }
      *(undefined1 *)&decoded_message->message_annotations = 1;
    }
  }
  else {
    _Var1 = is_properties_type_by_descriptor((AMQP_VALUE)l);
    if (_Var1) {
      iVar2 = amqpvalue_get_properties((AMQP_VALUE)message_receiver,(PROPERTIES_HANDLE *)&l_1);
      if (iVar2 == 0) {
        iVar2 = message_set_properties((MESSAGE_HANDLE)descriptor,(PROPERTIES_HANDLE)l_1);
        if (iVar2 != 0) {
          delivery_annotations = (annotations)xlogging_get_log_function();
          if (delivery_annotations != (annotations)0x0) {
            (*(code *)delivery_annotations)
                      (0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_receiver.c"
                       ,"decode_message_value_callback",0x3f,1,
                       "Error setting message properties on received message");
          }
          *(undefined1 *)&decoded_message->message_annotations = 1;
        }
        properties_destroy((PROPERTIES_HANDLE)l_1);
      }
      else {
        l_2 = xlogging_get_log_function();
        if (l_2 != (LOGGER_LOG)0x0) {
          (*l_2)(AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_receiver.c"
                 ,"decode_message_value_callback",0x38,1,"Error getting message properties");
        }
        *(undefined1 *)&decoded_message->message_annotations = 1;
      }
    }
    else {
      _Var1 = is_delivery_annotations_type_by_descriptor((AMQP_VALUE)l);
      if (_Var1) {
        l_3 = (LOGGER_LOG)amqpvalue_get_inplace_described_value((AMQP_VALUE)message_receiver);
        if ((AMQP_VALUE)l_3 == (AMQP_VALUE)0x0) {
          l_4 = xlogging_get_log_function();
          if (l_4 != (LOGGER_LOG)0x0) {
            (*l_4)(AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_receiver.c"
                   ,"decode_message_value_callback",0x4b,1,"Error getting delivery annotations");
          }
          *(undefined1 *)&decoded_message->message_annotations = 1;
        }
        else {
          iVar2 = message_set_delivery_annotations
                            ((MESSAGE_HANDLE)descriptor,(delivery_annotations)l_3);
          if (iVar2 != 0) {
            message_annotations = (annotations)xlogging_get_log_function();
            if (message_annotations != (annotations)0x0) {
              (*(code *)message_annotations)
                        (0,
                         "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_receiver.c"
                         ,"decode_message_value_callback",0x52,1,
                         "Error setting delivery annotations on received message");
            }
            *(undefined1 *)&decoded_message->message_annotations = 1;
          }
        }
      }
      else {
        _Var1 = is_message_annotations_type_by_descriptor((AMQP_VALUE)l);
        if (_Var1) {
          l_5 = (LOGGER_LOG)amqpvalue_get_inplace_described_value((AMQP_VALUE)message_receiver);
          if ((AMQP_VALUE)l_5 == (AMQP_VALUE)0x0) {
            l_6 = xlogging_get_log_function();
            if (l_6 != (LOGGER_LOG)0x0) {
              (*l_6)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_receiver.c"
                     ,"decode_message_value_callback",0x5c,1,"Error getting message annotations");
            }
            *(undefined1 *)&decoded_message->message_annotations = 1;
          }
          else {
            iVar2 = message_set_message_annotations
                              ((MESSAGE_HANDLE)descriptor,(message_annotations)l_5);
            if (iVar2 != 0) {
              header = (HEADER_HANDLE)xlogging_get_log_function();
              if (header != (HEADER_HANDLE)0x0) {
                (*(code *)header)(0,
                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_receiver.c"
                                  ,"decode_message_value_callback",99,1,
                                  "Error setting message annotations on received message");
              }
              *(undefined1 *)&decoded_message->message_annotations = 1;
            }
          }
        }
        else {
          _Var1 = is_header_type_by_descriptor((AMQP_VALUE)l);
          if (_Var1) {
            iVar2 = amqpvalue_get_header((AMQP_VALUE)message_receiver,(HEADER_HANDLE *)&l_7);
            if (iVar2 == 0) {
              iVar2 = message_set_header((MESSAGE_HANDLE)descriptor,(HEADER_HANDLE)l_7);
              if (iVar2 != 0) {
                footer = (annotations)xlogging_get_log_function();
                if (footer != (annotations)0x0) {
                  (*(code *)footer)(0,
                                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_receiver.c"
                                    ,"decode_message_value_callback",0x74,1,
                                    "Error setting message header on received message");
                }
                *(undefined1 *)&decoded_message->message_annotations = 1;
              }
              header_destroy((HEADER_HANDLE)l_7);
            }
            else {
              l_8 = xlogging_get_log_function();
              if (l_8 != (LOGGER_LOG)0x0) {
                (*l_8)(AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_receiver.c"
                       ,"decode_message_value_callback",0x6d,1,"Error getting message header");
              }
              *(undefined1 *)&decoded_message->message_annotations = 1;
            }
          }
          else {
            _Var1 = is_footer_type_by_descriptor((AMQP_VALUE)l);
            if (_Var1) {
              l_9 = (LOGGER_LOG)amqpvalue_get_inplace_described_value((AMQP_VALUE)message_receiver);
              if ((AMQP_VALUE)l_9 == (AMQP_VALUE)0x0) {
                l_10 = xlogging_get_log_function();
                if (l_10 != (LOGGER_LOG)0x0) {
                  (*l_10)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_receiver.c"
                          ,"decode_message_value_callback",0x80,1,"Error getting message footer");
                }
                *(undefined1 *)&decoded_message->message_annotations = 1;
              }
              else {
                iVar2 = message_set_footer((MESSAGE_HANDLE)descriptor,(annotations)l_9);
                if (iVar2 != 0) {
                  p_Stack_b0 = xlogging_get_log_function();
                  if (p_Stack_b0 != (LOGGER_LOG)0x0) {
                    (*p_Stack_b0)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_receiver.c"
                                  ,"decode_message_value_callback",0x87,1,
                                  "Error setting message footer on received message");
                  }
                  *(undefined1 *)&decoded_message->message_annotations = 1;
                }
              }
            }
            else {
              _Var1 = is_amqp_value_type_by_descriptor((AMQP_VALUE)l);
              if (_Var1) {
                iVar2 = message_get_body_type
                                  ((MESSAGE_HANDLE)descriptor,(MESSAGE_BODY_TYPE *)((long)&l_11 + 4)
                                  );
                if (iVar2 == 0) {
                  if (l_11._4_4_ == 1) {
                    l_13 = (LOGGER_LOG)
                           amqpvalue_get_inplace_described_value((AMQP_VALUE)message_receiver);
                    if ((AMQP_VALUE)l_13 == (AMQP_VALUE)0x0) {
                      l_14 = xlogging_get_log_function();
                      if (l_14 != (LOGGER_LOG)0x0) {
                        (*l_14)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_receiver.c"
                                ,"decode_message_value_callback",0xa0,1,
                                "Error getting body AMQP value");
                      }
                      *(undefined1 *)&decoded_message->message_annotations = 1;
                    }
                    else {
                      iVar2 = message_set_body_amqp_value
                                        ((MESSAGE_HANDLE)descriptor,(AMQP_VALUE)l_13);
                      if (iVar2 != 0) {
                        p_Stack_e0 = xlogging_get_log_function();
                        if (p_Stack_e0 != (LOGGER_LOG)0x0) {
                          (*p_Stack_e0)(AZ_LOG_ERROR,
                                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_receiver.c"
                                        ,"decode_message_value_callback",0xa7,1,
                                        "Error setting body AMQP value on received message");
                        }
                        *(undefined1 *)&decoded_message->message_annotations = 1;
                      }
                    }
                  }
                  else {
                    body_amqp_value = (AMQP_VALUE)xlogging_get_log_function();
                    if (body_amqp_value != (AMQP_VALUE)0x0) {
                      (*(code *)body_amqp_value)
                                (0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_receiver.c"
                                 ,"decode_message_value_callback",0x98,1,
                                 "Body already set on received message");
                    }
                    *(undefined1 *)&decoded_message->message_annotations = 1;
                  }
                }
                else {
                  l_12 = xlogging_get_log_function();
                  if (l_12 != (LOGGER_LOG)0x0) {
                    (*l_12)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_receiver.c"
                            ,"decode_message_value_callback",0x91,1,
                            "Error getting message body type");
                  }
                  *(undefined1 *)&decoded_message->message_annotations = 1;
                }
              }
              else {
                _Var1 = is_data_type_by_descriptor((AMQP_VALUE)l);
                if (_Var1) {
                  iVar2 = message_get_body_type
                                    ((MESSAGE_HANDLE)descriptor,
                                     (MESSAGE_BODY_TYPE *)((long)&l_15 + 4));
                  if (iVar2 == 0) {
                    if ((l_15._4_4_ == 1) || (l_15._4_4_ == 2)) {
                      value = amqpvalue_get_inplace_described_value((AMQP_VALUE)message_receiver);
                      if (value == (AMQP_VALUE)0x0) {
                        data_value._8_8_ = xlogging_get_log_function();
                        if ((LOGGER_LOG)data_value._8_8_ != (LOGGER_LOG)0x0) {
                          (*(code *)data_value._8_8_)
                                    (AZ_LOG_ERROR,
                                     "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_receiver.c"
                                     ,"decode_message_value_callback",0xc3,1,
                                     "Error getting body DATA value");
                        }
                        *(undefined1 *)&decoded_message->message_annotations = 1;
                      }
                      else {
                        iVar2 = amqpvalue_get_binary(value,(amqp_binary *)&l_18);
                        if (iVar2 == 0) {
                          amqp_data.length._0_4_ = data_value.bytes._0_4_;
                          amqp_data.bytes = (uchar *)l_18;
                          amqp_data.length._4_4_ = 0;
                          iVar2 = message_add_body_amqp_data((MESSAGE_HANDLE)descriptor,amqp_data);
                          if (iVar2 != 0) {
                            p_Var3 = xlogging_get_log_function();
                            if (p_Var3 != (LOGGER_LOG)0x0) {
                              (*p_Var3)(AZ_LOG_ERROR,
                                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_receiver.c"
                                        ,"decode_message_value_callback",0xd5,1,
                                        "Error adding body DATA to received message");
                            }
                            *(undefined1 *)&decoded_message->message_annotations = 1;
                          }
                        }
                        else {
                          p_Var3 = xlogging_get_log_function();
                          if (p_Var3 != (LOGGER_LOG)0x0) {
                            (*p_Var3)(AZ_LOG_ERROR,
                                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_receiver.c"
                                      ,"decode_message_value_callback",0xcb,1,
                                      "Error getting body DATA AMQP value");
                          }
                          *(undefined1 *)&decoded_message->message_annotations = 1;
                        }
                      }
                    }
                    else {
                      p_Var3 = xlogging_get_log_function();
                      if (p_Var3 != (LOGGER_LOG)0x0) {
                        (*p_Var3)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_receiver.c"
                                  ,"decode_message_value_callback",0xbb,1,
                                  "Message body type already set to something different than AMQP DATA"
                                 );
                      }
                      *(undefined1 *)&decoded_message->message_annotations = 1;
                    }
                  }
                  else {
                    p_Var3 = xlogging_get_log_function();
                    if (p_Var3 != (LOGGER_LOG)0x0) {
                      (*p_Var3)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_receiver.c"
                                ,"decode_message_value_callback",0xb3,1,
                                "Error getting message body type");
                    }
                    *(undefined1 *)&decoded_message->message_annotations = 1;
                  }
                }
                else {
                  p_Var3 = xlogging_get_log_function();
                  if (p_Var3 != (LOGGER_LOG)0x0) {
                    (*p_Var3)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_receiver.c"
                              ,"decode_message_value_callback",0xdf,1,"Failed decoding descriptor");
                  }
                  *(undefined1 *)&decoded_message->message_annotations = 1;
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void decode_message_value_callback(void* context, AMQP_VALUE decoded_value)
{
    MESSAGE_RECEIVER_INSTANCE* message_receiver = (MESSAGE_RECEIVER_INSTANCE*)context;
    MESSAGE_HANDLE decoded_message = message_receiver->decoded_message;
    AMQP_VALUE descriptor = amqpvalue_get_inplace_descriptor(decoded_value);

    if (is_application_properties_type_by_descriptor(descriptor))
    {
        if (message_set_application_properties(decoded_message, decoded_value) != 0)
        {
            LogError("Error setting application properties on received message");
            message_receiver->decode_error = true;
        }
    }
    else if (is_properties_type_by_descriptor(descriptor))
    {
        PROPERTIES_HANDLE properties;
        if (amqpvalue_get_properties(decoded_value, &properties) != 0)
        {
            LogError("Error getting message properties");
            message_receiver->decode_error = true;
        }
        else
        {
            if (message_set_properties(decoded_message, properties) != 0)
            {
                LogError("Error setting message properties on received message");
                message_receiver->decode_error = true;
            }

            properties_destroy(properties);
        }
    }
    else if (is_delivery_annotations_type_by_descriptor(descriptor))
    {
        annotations delivery_annotations = amqpvalue_get_inplace_described_value(decoded_value);
        if (delivery_annotations == NULL)
        {
            LogError("Error getting delivery annotations");
            message_receiver->decode_error = true;
        }
        else
        {
            if (message_set_delivery_annotations(decoded_message, delivery_annotations) != 0)
            {
                LogError("Error setting delivery annotations on received message");
                message_receiver->decode_error = true;
            }
        }
    }
    else if (is_message_annotations_type_by_descriptor(descriptor))
    {
        annotations message_annotations = amqpvalue_get_inplace_described_value(decoded_value);
        if (message_annotations == NULL)
        {
            LogError("Error getting message annotations");
            message_receiver->decode_error = true;
        }
        else
        {
            if (message_set_message_annotations(decoded_message, message_annotations) != 0)
            {
                LogError("Error setting message annotations on received message");
                message_receiver->decode_error = true;
            }
        }
    }
    else if (is_header_type_by_descriptor(descriptor))
    {
        HEADER_HANDLE header;
        if (amqpvalue_get_header(decoded_value, &header) != 0)
        {
            LogError("Error getting message header");
            message_receiver->decode_error = true;
        }
        else
        {
            if (message_set_header(decoded_message, header) != 0)
            {
                LogError("Error setting message header on received message");
                message_receiver->decode_error = true;
            }

            header_destroy(header);
        }
    }
    else if (is_footer_type_by_descriptor(descriptor))
    {
        annotations footer = amqpvalue_get_inplace_described_value(decoded_value);
        if (footer == NULL)
        {
            LogError("Error getting message footer");
            message_receiver->decode_error = true;
        }
        else
        {
            if (message_set_footer(decoded_message, footer) != 0)
            {
                LogError("Error setting message footer on received message");
                message_receiver->decode_error = true;
            }
        }
    }
    else if (is_amqp_value_type_by_descriptor(descriptor))
    {
        MESSAGE_BODY_TYPE body_type;
        if (message_get_body_type(decoded_message, &body_type) != 0)
        {
            LogError("Error getting message body type");
            message_receiver->decode_error = true;
        }
        else
        {
            if (body_type != MESSAGE_BODY_TYPE_NONE)
            {
                LogError("Body already set on received message");
                message_receiver->decode_error = true;
            }
            else
            {
                AMQP_VALUE body_amqp_value = amqpvalue_get_inplace_described_value(decoded_value);
                if (body_amqp_value == NULL)
                {
                    LogError("Error getting body AMQP value");
                    message_receiver->decode_error = true;
                }
                else
                {
                    if (message_set_body_amqp_value(decoded_message, body_amqp_value) != 0)
                    {
                        LogError("Error setting body AMQP value on received message");
                        message_receiver->decode_error = true;
                    }
                }
            }
        }
    }
    else if (is_data_type_by_descriptor(descriptor))
    {
        MESSAGE_BODY_TYPE body_type;
        if (message_get_body_type(decoded_message, &body_type) != 0)
        {
            LogError("Error getting message body type");
            message_receiver->decode_error = true;
        }
        else
        {
            if ((body_type != MESSAGE_BODY_TYPE_NONE) &&
                (body_type != MESSAGE_BODY_TYPE_DATA))
            {
                LogError("Message body type already set to something different than AMQP DATA");
                message_receiver->decode_error = true;
            }
            else
            {
                AMQP_VALUE body_data_value = amqpvalue_get_inplace_described_value(decoded_value);
                if (body_data_value == NULL)
                {
                    LogError("Error getting body DATA value");
                    message_receiver->decode_error = true;
                }
                else
                {
                    data data_value;
                    if (amqpvalue_get_data(body_data_value, &data_value) != 0)
                    {
                        LogError("Error getting body DATA AMQP value");
                        message_receiver->decode_error = true;
                    }
                    else
                    {
                        BINARY_DATA binary_data;
                        binary_data.bytes = (const unsigned char*)data_value.bytes;
                        binary_data.length = data_value.length;
                        if (message_add_body_amqp_data(decoded_message, binary_data) != 0)
                        {
                            LogError("Error adding body DATA to received message");
                            message_receiver->decode_error = true;
                        }
                    }
                }
            }
        }
    }
    else
    {
        LogError("Failed decoding descriptor");
        message_receiver->decode_error = true;
    }
}